

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O1

void __thiscall
TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_Test::
~TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_Test
          (TEST_MockPlugin_installComparatorRecordsTheComparatorButNotInstallsItYet_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMockPlugin_002cbd80;
  MockSupportPlugin::~MockSupportPlugin(&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin);
  StringBufferTestOutput::~StringBufferTestOutput
            (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).output);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x80);
  return;
}

Assistant:

TEST(MockPlugin, installComparatorRecordsTheComparatorButNotInstallsItYet)
{
    MockFailureReporterInstaller failureReporterInstaller;

    DummyComparator comparator;
    plugin.installComparator("myType", comparator);
    mock().expectOneCall("foo").withParameterOfType("myType", "name", NULLPTR);
    mock().actualCall("foo").withParameterOfType("myType", "name", NULLPTR);

    MockNoWayToCompareCustomTypeFailure failure(test, "myType");
    CHECK_EXPECTED_MOCK_FAILURE(failure);

    plugin.clear();
}